

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pull_by_size.c
# Opt level: O3

int kseq_read(kseq_t *seq)

{
  kstring_t *str;
  byte bVar1;
  kstream_t *ks;
  ulong uVar2;
  bool bVar3;
  int iVar4;
  char *pcVar5;
  int iVar6;
  ulong uVar7;
  size_t sVar8;
  long lVar9;
  int iVar10;
  uint uVar11;
  size_t __size;
  uchar *puVar12;
  int c;
  uint local_2c;
  
  ks = seq->f;
  if (seq->last_char == 0) {
    iVar6 = ks->begin;
    iVar4 = ks->end;
    iVar10 = -1;
    do {
      if ((ks->is_eof != 0) && (iVar4 <= iVar6)) {
        return -1;
      }
      puVar12 = ks->buf;
      if (iVar4 <= iVar6) {
        ks->begin = 0;
        iVar4 = gzread(ks->f,puVar12,0xffff);
        ks->end = iVar4;
        if (iVar4 == 0) goto LAB_00104dba;
        iVar6 = ks->begin;
        puVar12 = ks->buf;
      }
      lVar9 = (long)iVar6;
      iVar6 = iVar6 + 1;
      ks->begin = iVar6;
      bVar1 = puVar12[lVar9];
      local_2c = (uint)bVar1;
    } while ((local_2c != 0x40) && (bVar1 != 0x3e));
    seq->last_char = (uint)bVar1;
  }
  (seq->qual).l = 0;
  (seq->seq).l = 0;
  (seq->comment).l = 0;
  iVar6 = ks_getuntil2(ks,0,&seq->name,(int *)&local_2c,0);
  if (iVar6 < 0) {
    iVar6 = -1;
  }
  else {
    if (local_2c != 10) {
      ks_getuntil2(ks,2,&seq->comment,(int *)0x0,0);
    }
    if ((seq->seq).s == (char *)0x0) {
      (seq->seq).m = 0x100;
      pcVar5 = (char *)malloc(0x100);
      (seq->seq).s = pcVar5;
    }
    str = &seq->seq;
    iVar6 = ks->begin;
    iVar4 = ks->end;
    bVar3 = iVar6 < iVar4;
    if (ks->is_eof == 0 || bVar3) {
      do {
        puVar12 = ks->buf;
        if (!bVar3) {
          ks->begin = 0;
          iVar4 = gzread(ks->f,puVar12,0xffff);
          ks->end = iVar4;
          if (iVar4 == 0) {
            ks->is_eof = 1;
            break;
          }
          iVar6 = ks->begin;
          puVar12 = ks->buf;
        }
        lVar9 = (long)iVar6;
        iVar6 = iVar6 + 1;
        ks->begin = iVar6;
        bVar1 = puVar12[lVar9];
        local_2c = (uint)bVar1;
        uVar11 = (uint)bVar1;
        if (local_2c < 0x2b) {
          if (uVar11 != 10) goto LAB_00104c2e;
        }
        else {
          if (uVar11 == 0x2b) goto LAB_00104c97;
          if ((uVar11 == 0x3e) || (uVar11 == 0x40)) {
            seq->last_char = uVar11;
            goto LAB_00104c97;
          }
LAB_00104c2e:
          sVar8 = (seq->seq).l;
          (seq->seq).l = sVar8 + 1;
          (seq->seq).s[sVar8] = bVar1;
          ks_getuntil2(ks,2,str,(int *)0x0,1);
          iVar6 = ks->begin;
          iVar4 = ks->end;
        }
        bVar3 = iVar6 < iVar4;
      } while ((ks->is_eof == 0) || (iVar6 < iVar4));
    }
    local_2c = 0xffffffff;
LAB_00104c97:
    sVar8 = (seq->seq).l;
    pcVar5 = (seq->seq).s;
    uVar7 = sVar8 + 1;
    if ((seq->seq).m <= uVar7) {
      uVar7 = uVar7 >> 1 | uVar7;
      uVar7 = uVar7 >> 2 | uVar7;
      uVar7 = uVar7 >> 4 | uVar7;
      uVar7 = uVar7 >> 8 | uVar7;
      __size = (uVar7 >> 0x10 | uVar7) + 1;
      (seq->seq).m = __size;
      pcVar5 = (char *)realloc(pcVar5,__size);
      (seq->seq).s = pcVar5;
      sVar8 = (seq->seq).l;
    }
    pcVar5[sVar8] = '\0';
    if (local_2c == 0x2b) {
      uVar7 = (seq->seq).m;
      if ((seq->qual).m < uVar7) {
        (seq->qual).m = uVar7;
        pcVar5 = (char *)realloc((seq->qual).s,uVar7);
        (seq->qual).s = pcVar5;
      }
      iVar6 = ks->begin;
      iVar4 = ks->end;
      iVar10 = -2;
      do {
        if ((ks->is_eof != 0) && (iVar4 <= iVar6)) {
          return -2;
        }
        puVar12 = ks->buf;
        if (iVar4 <= iVar6) {
          ks->begin = 0;
          iVar4 = gzread(ks->f,puVar12,0xffff);
          ks->end = iVar4;
          if (iVar4 == 0) {
LAB_00104dba:
            ks->is_eof = 1;
            return iVar10;
          }
          iVar6 = ks->begin;
          puVar12 = ks->buf;
        }
        lVar9 = (long)iVar6;
        iVar6 = iVar6 + 1;
        ks->begin = iVar6;
        local_2c = (uint)puVar12[lVar9];
      } while (local_2c != 10);
      local_2c = 10;
      do {
        iVar6 = ks_getuntil2(ks,2,&seq->qual,(int *)0x0,1);
        uVar7 = str->l;
        uVar2 = (seq->qual).l;
        if (iVar6 < 0) break;
      } while (uVar2 < uVar7);
      seq->last_char = 0;
      iVar6 = -2;
      if (uVar7 == uVar2) {
        iVar6 = (int)uVar7;
      }
    }
    else {
      iVar6 = (int)str->l;
    }
  }
  return iVar6;
}

Assistant:

__KSEQ_READ(static)

/*
extern char const *progname;
extern int verbose_flag;
*/

int pull_by_size(char *input_file, int min, int max,int length, int convert, int just_count) {
	gzFile fp;
	int count=0,l;
	int hit = 0;
	int excluded = 0;
	int is_fasta = 0; /* assume fastq */
	kseq_t *seq;

	/* open fasta file */
	fp = gzopen(input_file,"r");
	if (!fp) {
		fprintf(stderr,"%s - Couldn't open fasta file %s\n",progname,input_file);
		exit(EXIT_FAILURE);
	}

	seq = kseq_init(fp);

	/* determine file type */
	l = kseq_read(seq); /* read the first sequence */
	is_fasta = seq->qual.s == NULL ? 1 : 0;
	gzrewind(fp); 
	kseq_rewind(seq); /* rewind to beginning for main loop */

    if (verbose_flag) {
        if (is_fasta)
            fprintf(stderr, "Input is FASTA format\n");
        else
            fprintf(stderr, "Input is FASTQ format\n");
    }

	/* search through list and see if this header matches */
	while((l = kseq_read(seq)) >= 0) {
		hit = size_filter(seq, is_fasta, min, max, length, convert, just_count);
		if (hit)
			count++;
		else
			excluded++;
	}
	kseq_destroy(seq);
	gzclose(fp); /* done reading file */

	if (just_count) {
		fprintf(stdout, "Total output: %i\n", count);
		fprintf(stdout, "Total excluded: %i\n", excluded);
	}
	return count;
}